

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloter_interface.h
# Opt level: O1

void __thiscall cppnet::AlloterWrap::PoolDelete<cppnet::Event>(AlloterWrap *this,Event **c)

{
  element_type *peVar1;
  void *data;
  Event *local_18;
  
  if (*c != (Event *)0x0) {
    (**(*c)->_vptr_Event)();
    local_18 = *c;
    peVar1 = (this->_alloter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    (*peVar1->_vptr_Alloter[5])(peVar1,&local_18,0x28);
    *c = (Event *)0x0;
  }
  return;
}

Assistant:

void AlloterWrap::PoolDelete(T* &c) {
    if (!c) {
        return;
    }

    c->~T();

    uint32_t len = sizeof(T);
    void* data = (void*)c;
    _alloter->Free(data, len);
    c = nullptr;
}